

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

int __thiscall re2::Prog::first_byte(Prog *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  undefined1 local_31;
  Prog *local_30;
  undefined1 *local_28;
  Prog **local_20;
  
  local_20 = &local_30;
  local_28 = &local_31;
  *in_FS_OFFSET = (long)&local_28;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  local_30 = this;
  iVar1 = pthread_once(&(this->first_byte_once_)._M_once,__once_proxy);
  if (iVar1 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    return this->first_byte_;
  }
  uVar2 = std::__throw_system_error(iVar1);
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  _Unwind_Resume(uVar2);
}

Assistant:

int Prog::first_byte() {
  std::call_once(first_byte_once_, [](Prog* prog) {
    prog->first_byte_ = prog->ComputeFirstByte();
  }, this);
  return first_byte_;
}